

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_g(bsc_request_t type,int word_size)

{
  int word_size_local;
  bsc_request_t type_local;
  
  if ((s_g[0] == 0.0) && (!NAN(s_g[0]))) {
    load_param_g_once();
  }
  return s_g[type] + s_o[type] / (double)word_size;
}

Assistant:

double bsc_g(bsc_request_t type, int word_size)
{
    if ( s_g[0] == 0.0 ) {
        load_param_g_once();
    }
    return s_g[type] + s_o[type] / word_size;
}